

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstrieiterator.cpp
# Opt level: O0

UChar * __thiscall
icu_63::UCharsTrie::Iterator::branchNext
          (Iterator *this,UChar *pos,int32_t length,UErrorCode *errorCode)

{
  char16_t srcChar;
  char16_t cVar1;
  UVector32 *pUVar2;
  uint uVar3;
  int32_t iVar4;
  char16_t *pcVar5;
  int32_t value;
  UBool isFinal;
  int32_t node;
  UChar trieUnit;
  UErrorCode *errorCode_local;
  UChar *pUStack_20;
  int32_t length_local;
  UChar *pos_local;
  Iterator *this_local;
  
  errorCode_local._4_4_ = length;
  pUStack_20 = pos;
  while (5 < errorCode_local._4_4_) {
    pUVar2 = this->stack_;
    pcVar5 = skipDelta(pUStack_20 + 1);
    UVector32::addElement(pUVar2,(int32_t)((long)pcVar5 - (long)this->uchars_ >> 1),errorCode);
    pUVar2 = this->stack_;
    uVar3 = UnicodeString::length(&this->str_);
    UVector32::addElement
              (pUVar2,(errorCode_local._4_4_ - (errorCode_local._4_4_ >> 1)) * 0x10000 | uVar3,
               errorCode);
    pUStack_20 = jumpByDelta(pUStack_20 + 1);
    errorCode_local._4_4_ = errorCode_local._4_4_ >> 1;
  }
  srcChar = *pUStack_20;
  cVar1 = pUStack_20[1];
  uVar3 = (ushort)cVar1 & 0x7fff;
  iVar4 = readValue(pUStack_20 + 2,uVar3);
  pcVar5 = skipValue(pUStack_20 + 2,uVar3);
  UVector32::addElement(this->stack_,(int32_t)((long)pcVar5 - (long)this->uchars_ >> 1),errorCode);
  pUVar2 = this->stack_;
  uVar3 = UnicodeString::length(&this->str_);
  UVector32::addElement(pUVar2,(errorCode_local._4_4_ + -1) * 0x10000 | uVar3,errorCode);
  UnicodeString::append(&this->str_,srcChar);
  if ((char)((int)(uint)(ushort)cVar1 >> 0xf) == '\0') {
    this_local = (Iterator *)(pcVar5 + iVar4);
  }
  else {
    this->pos_ = (char16_t *)0x0;
    this->value_ = iVar4;
    this_local = (Iterator *)0x0;
  }
  return (UChar *)this_local;
}

Assistant:

const UChar *
UCharsTrie::Iterator::branchNext(const UChar *pos, int32_t length, UErrorCode &errorCode) {
    while(length>kMaxBranchLinearSubNodeLength) {
        ++pos;  // ignore the comparison unit
        // Push state for the greater-or-equal edge.
        stack_->addElement((int32_t)(skipDelta(pos)-uchars_), errorCode);
        stack_->addElement(((length-(length>>1))<<16)|str_.length(), errorCode);
        // Follow the less-than edge.
        length>>=1;
        pos=jumpByDelta(pos);
    }
    // List of key-value pairs where values are either final values or jump deltas.
    // Read the first (key, value) pair.
    UChar trieUnit=*pos++;
    int32_t node=*pos++;
    UBool isFinal=(UBool)(node>>15);
    int32_t value=readValue(pos, node&=0x7fff);
    pos=skipValue(pos, node);
    stack_->addElement((int32_t)(pos-uchars_), errorCode);
    stack_->addElement(((length-1)<<16)|str_.length(), errorCode);
    str_.append(trieUnit);
    if(isFinal) {
        pos_=NULL;
        value_=value;
        return NULL;
    } else {
        return pos+value;
    }
}